

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

void __thiscall GF2::BFunc<8UL>::FWHT(BFunc<8UL> *this,Func<8UL,_int> *zfRight)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  word i;
  long lVar5;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  
  uVar8 = 0;
  do {
    zfRight->_vals[uVar8] = (this->super_Func<8UL,_bool>)._vals[uVar8] - 1 | 1;
    uVar3 = (int)uVar8 + 1U & 0xff;
    uVar8 = (ulong)uVar3;
  } while (uVar3 != 0);
  lVar5 = 0;
  do {
    lVar4 = 1L << ((byte)lVar5 & 0x3f);
    lVar6 = 2L << ((byte)lVar5 & 0x3f);
    uVar8 = 0;
    piVar9 = zfRight->_vals;
    lVar10 = lVar4;
    piVar7 = zfRight->_vals;
    do {
      do {
        iVar1 = *piVar9;
        iVar2 = piVar9[lVar4];
        *piVar9 = iVar2 + iVar1;
        piVar9[lVar4] = iVar1 - iVar2;
        lVar10 = lVar10 + -1;
        piVar9 = piVar9 + 1;
      } while (lVar10 != 0);
      uVar8 = uVar8 + lVar6;
      piVar9 = piVar7 + lVar6;
      lVar10 = lVar4;
      piVar7 = piVar9;
    } while (uVar8 < 0x100);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  return;
}

Assistant:

void FWHT(Func<_n, int>& zfRight) const
	{	
		Preimage x;
		// zfRight <- (-1)^this
		do 
			zfRight[x] = Get(x) ? 1 : -1;
		while (x.Next());
		// zf <- FWHT(zf)
		for (word i = 0; i < _n; ++i)
		for (word j = 0; j < _size; j += WORD_1 << (i + 1))
		for (word k = 0; k < WORD_1 << i; ++k)
		{
			int t = zfRight[j + k];
			zfRight[j + k] += zfRight[j + k + (WORD_1 << i)];
			zfRight[j + k + (WORD_1 << i)] = 
				t - zfRight[j + k + (WORD_1 << i)];
		}
	}